

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O2

bool __thiscall
tinyusdz::Prim::replace_child(Prim *this,string *child_prim_name,Prim *rhs,string *err)

{
  multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  __type _Var2;
  ulong uVar3;
  size_type sVar4;
  string *args;
  ulong uVar5;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  long lVar7;
  pointer pPVar8;
  pointer pPVar9;
  Prim *this_01;
  Prim *pPVar10;
  allocator local_160 [32];
  string local_140;
  string local_120 [32];
  Path local_100;
  
  args = err;
  if ((err != (string *)0x0) && (child_prim_name->_M_string_length == 0)) {
    ::std::__cxx11::string::append((char *)err);
  }
  bVar1 = ValidatePrimElementName(child_prim_name);
  if ((err != (string *)0x0) && (!bVar1)) {
    ::std::__cxx11::string::string
              ((string *)&local_140,"`{}` is not a valid Prim name.\n",local_160);
    fmt::format<std::__cxx11::string>
              ((string *)&local_100,(fmt *)&local_140,(string *)child_prim_name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    ::std::__cxx11::string::append((string *)err);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  pPVar8 = (this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pPVar9 = (this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar3 = ((long)pPVar9 - (long)pPVar8) / 0x350;
  this_00 = &this->_childrenNameSet;
  if (uVar3 != (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_00);
    lVar6 = 0x1a0;
    uVar5 = 0;
    while( true ) {
      pPVar8 = (this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pPVar9 = (this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar3 = ((long)pPVar9 - (long)pPVar8) / 0x350;
      if (uVar3 <= uVar5) break;
      if ((*(long *)((long)&(pPVar8->_abs_path)._prim_part._M_string_length + lVar6) == 0) ||
         (sVar4 = ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)this_00,
                          (key_type *)((long)&(pPVar8->_abs_path)._prim_part._M_dataplus + lVar6)),
         sVar4 != 0)) {
        if (err == (string *)0x0) {
          return false;
        }
        ::std::__cxx11::string::assign((char *)err);
        return false;
      }
      ::std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_equal<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(((this->_children).
                           super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
                           _M_impl.super__Vector_impl_data._M_start)->_abs_path)._prim_part.
                         _M_dataplus + lVar6));
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x350;
    }
  }
  ::std::__cxx11::string::string(local_120,(string *)child_prim_name);
  ::std::__cxx11::string::string((string *)local_160,local_120);
  ::std::__cxx11::string::string((string *)&local_100,(string *)local_160);
  ::std::__cxx11::string::string((string *)&local_140,(string *)&local_100);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_100,(string *)&local_140);
  lVar6 = 0;
  for (lVar7 = (long)uVar3 >> 2;
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&(pPVar8->_elementPath)._prim_part._M_dataplus + lVar6), 0 < lVar7;
      lVar7 = lVar7 + -1) {
    _Var2 = ::std::operator==(__lhs,&local_100._prim_part);
    if (_Var2) {
      this_01 = (Prim *)((long)&(pPVar8->_abs_path)._prim_part._M_dataplus + lVar6);
      goto LAB_002145f7;
    }
    _Var2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&pPVar8[1]._elementPath._prim_part._M_dataplus + lVar6),
                              &local_100._prim_part);
    if (_Var2) {
      this_01 = (Prim *)((long)&pPVar8[1]._abs_path._prim_part._M_dataplus + lVar6);
      goto LAB_002145f7;
    }
    _Var2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&pPVar8[2]._elementPath._prim_part._M_dataplus + lVar6),
                              &local_100._prim_part);
    if (_Var2) {
      this_01 = (Prim *)((long)&pPVar8[2]._abs_path._prim_part._M_dataplus + lVar6);
      goto LAB_002145f7;
    }
    _Var2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&pPVar8[3]._elementPath._prim_part._M_dataplus + lVar6),
                              &local_100._prim_part);
    if (_Var2) {
      this_01 = (Prim *)((long)&pPVar8[3]._abs_path._prim_part._M_dataplus + lVar6);
      goto LAB_002145f7;
    }
    lVar6 = lVar6 + 0xd40;
  }
  lVar7 = ((long)pPVar9 + (-lVar6 - (long)pPVar8)) / 0x350;
  pPVar10 = (Prim *)((long)&(pPVar8->_abs_path)._prim_part._M_dataplus + lVar6);
  if (lVar7 == 1) {
LAB_002147d5:
    _Var2 = ::std::operator==(&(pPVar10->_elementPath)._prim_part,&local_100._prim_part);
    this_01 = pPVar10;
    if (!_Var2) {
      this_01 = pPVar9;
    }
  }
  else if (lVar7 == 3) {
    _Var2 = ::std::operator==(__lhs,&local_100._prim_part);
    this_01 = pPVar10;
    if (!_Var2) {
      pPVar10 = (Prim *)((long)&pPVar8[1]._abs_path._prim_part._M_dataplus + lVar6);
      goto LAB_002147ab;
    }
  }
  else {
    this_01 = pPVar9;
    if (lVar7 == 2) {
LAB_002147ab:
      _Var2 = ::std::operator==(&(pPVar10->_elementPath)._prim_part,&local_100._prim_part);
      this_01 = pPVar10;
      if (!_Var2) {
        pPVar10 = pPVar10 + 1;
        goto LAB_002147d5;
      }
    }
  }
LAB_002145f7:
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  pPVar8 = (this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  bVar1 = SetPrimElementName(&rhs->_data,child_prim_name);
  if (this_01 == pPVar8) {
    if (!bVar1) goto LAB_00214726;
    ::std::__cxx11::string::string((string *)&local_140,"",local_160);
    Path::Path(&local_100,child_prim_name,&local_140);
    Path::operator=(&rhs->_elementPath,&local_100);
    Path::~Path(&local_100);
    ::std::__cxx11::string::_M_dispose();
    ::std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_equal<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)this_00,child_prim_name);
    ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::emplace_back<tinyusdz::Prim>
              ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)&this->_children,rhs);
  }
  else {
    if (!bVar1) {
LAB_00214726:
      if (err != (string *)0x0) {
        ::std::__cxx11::string::string
                  ((string *)&local_140,"Internal error. cannot modify Prim\'s elementName.\n",
                   local_160);
        fmt::format(&local_100._prim_part,&local_140);
        ::std::__cxx11::string::operator=((string *)err,(string *)&local_100);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
      }
      return false;
    }
    ::std::__cxx11::string::string((string *)&local_140,"",local_160);
    Path::Path(&local_100,child_prim_name,&local_140);
    Path::operator=(&rhs->_elementPath,&local_100);
    Path::~Path(&local_100);
    ::std::__cxx11::string::_M_dispose();
    operator=(this_01,rhs);
  }
  this->_child_dirty = true;
  return true;
}

Assistant:

bool Prim::replace_child(const std::string &child_prim_name, Prim &&rhs,
                         std::string *err) {
#if defined(TINYUSDZ_ENABLE_THREAD)
  // TODO: Only take a lock when dirty.
  std::lock_guard<std::mutex> lock(_mutex);
#endif

  if (child_prim_name.empty()) {
    if (err) {
      (*err) += "child_prim_name is empty.\n";
    }
  }

  if (!ValidatePrimElementName(child_prim_name)) {
    if (err) {
      (*err) +=
          fmt::format("`{}` is not a valid Prim name.\n", child_prim_name);
    }
  }

  if (_children.size() != _childrenNameSet.size()) {
    // Rebuild _childrenNames
    _childrenNameSet.clear();
    for (size_t i = 0; i < _children.size(); i++) {
      if (_children[i].element_name().empty()) {
        if (err) {
          (*err) =
              "Internal error: Existing child Prim's elementName is empty.\n";
        }
        return false;
      }

      if (_childrenNameSet.count(_children[i].element_name())) {
        if (err) {
          (*err) =
              "Internal error: _children contains Prim with same "
              "elementName.\n";
        }
        return false;
      }

      _childrenNameSet.insert(_children[i].element_name());
    }
  }

  // Simple linear scan
  auto result = std::find_if(_children.begin(), _children.end(),
                             [child_prim_name](const Prim &p) {
                               return (p.element_name() == child_prim_name);
                             });

  if (result != _children.end()) {
    // Need to modify both Prim::data::name and Prim::elementPath
    if (!SetPrimElementName(rhs.get_data(), child_prim_name)) {
      if (err) {
        (*err) =
            fmt::format("Internal error. cannot modify Prim's elementName.\n");
      }
      return false;
    }
    rhs.element_path() = Path(child_prim_name, /* prop_part */ "");

    (*result) = std::move(rhs);  // replace

  } else {
    // Need to modify both Prim::data::name and Prim::elementPath
    if (!SetPrimElementName(rhs.get_data(), child_prim_name)) {
      if (err) {
        (*err) =
            fmt::format("Internal error. cannot modify Prim's elementName.\n");
      }
      return false;
    }
    rhs.element_path() = Path(child_prim_name, /* prop_part */ "");

    _childrenNameSet.insert(child_prim_name);
    _children.emplace_back(std::move(rhs));  // add
  }

  _child_dirty = true;

  return true;
}